

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O3

void __thiscall
opengv::absolute_pose::modules::Epnp::mat_to_quat(Epnp *this,double (*R) [3],double *q)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  
  dVar3 = (*R)[0];
  dVar1 = R[1][1];
  dVar2 = R[2][2];
  dVar4 = dVar3 + dVar1 + dVar2;
  if (dVar4 <= 0.0) {
    if ((dVar3 <= dVar1) || (dVar3 <= dVar2)) {
      if (dVar1 <= dVar2) {
        *q = R[2][0] + (*R)[2];
        q[1] = R[2][1] + R[1][2];
        dVar3 = ((R[2][2] + 1.0) - (*R)[0]) - R[1][1];
        auVar5._8_8_ = 0;
        auVar5._0_8_ = dVar3;
        q[2] = dVar3;
        dVar4 = (*R)[1] - R[1][0];
      }
      else {
        *q = R[1][0] + (*R)[1];
        dVar3 = ((R[1][1] + 1.0) - (*R)[0]) - R[2][2];
        auVar5._8_8_ = 0;
        auVar5._0_8_ = dVar3;
        q[1] = dVar3;
        q[2] = R[2][1] + R[1][2];
        dVar4 = R[2][0] - (*R)[2];
      }
    }
    else {
      dVar2 = ((dVar3 + 1.0) - dVar1) - dVar2;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = dVar2;
      *q = dVar2;
      q[1] = R[1][0] + (*R)[1];
      q[2] = R[2][0] + (*R)[2];
      dVar4 = R[1][2] - R[2][1];
    }
  }
  else {
    dVar4 = dVar4 + 1.0;
    *q = R[1][2] - R[2][1];
    q[1] = R[2][0] - (*R)[2];
    q[2] = (*R)[1] - R[1][0];
    auVar5._8_8_ = 0;
    auVar5._0_8_ = dVar4;
  }
  q[3] = dVar4;
  if (auVar5._0_8_ < 0.0) {
    dVar3 = sqrt(auVar5._0_8_);
  }
  else {
    auVar5 = vsqrtsd_avx(auVar5,auVar5);
    dVar3 = auVar5._0_8_;
  }
  dVar3 = 0.5 / dVar3;
  *q = dVar3 * *q;
  q[1] = dVar3 * q[1];
  q[2] = dVar3 * q[2];
  q[3] = dVar3 * q[3];
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::mat_to_quat(
    const double R[3][3],
    double q[4])
{
  double tr = R[0][0] + R[1][1] + R[2][2];
  double n4;

  if (tr > 0.0f)
  {
    q[0] = R[1][2] - R[2][1];
    q[1] = R[2][0] - R[0][2];
    q[2] = R[0][1] - R[1][0];
    q[3] = tr + 1.0f;
    n4 = q[3];
  }
  else if ( (R[0][0] > R[1][1]) && (R[0][0] > R[2][2]) )
  {
    q[0] = 1.0f + R[0][0] - R[1][1] - R[2][2];
    q[1] = R[1][0] + R[0][1];
    q[2] = R[2][0] + R[0][2];
    q[3] = R[1][2] - R[2][1];
    n4 = q[0];
  }
  else if (R[1][1] > R[2][2])
  {
    q[0] = R[1][0] + R[0][1];
    q[1] = 1.0f + R[1][1] - R[0][0] - R[2][2];
    q[2] = R[2][1] + R[1][2];
    q[3] = R[2][0] - R[0][2];
    n4 = q[1];
  }
  else
  {
    q[0] = R[2][0] + R[0][2];
    q[1] = R[2][1] + R[1][2];
    q[2] = 1.0f + R[2][2] - R[0][0] - R[1][1];
    q[3] = R[0][1] - R[1][0];
    n4 = q[2];
  }
  double scale = 0.5f / double(sqrt(n4));

  q[0] *= scale;
  q[1] *= scale;
  q[2] *= scale;
  q[3] *= scale;
}